

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

bool __thiscall mpt::object::set(object *this,char *name,value *val,logger *out)

{
  int iVar1;
  char *pcVar2;
  type_t tVar3;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 uVar5;
  char *pcStack_78;
  int type;
  char *err;
  property pr;
  int ret;
  char *str;
  logger *out_local;
  value *val_local;
  char *name_local;
  object *this_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  pcVar2 = value::string(val);
  if (pcVar2 == (char *)0x0) {
    pr._buf._12_4_ = mpt_object_set_value(this,name,val);
  }
  else {
    pr._buf._12_4_ = mpt_object_set_string(this,name,pcVar2,0);
  }
  if ((int)pr._buf._12_4_ < 0) {
    if (out == (logger *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      property::property((property *)&err,"",(char *)0x0);
      iVar1 = (**this->_vptr_object)(this,&err);
      if (iVar1 < 0) {
        err = "object";
      }
      if (pr._buf._12_4_ == -1) {
        if (name == (char *)0x0) {
          logger::message(out,"mpt::object::set",3,"%s: %s","bad property",err);
        }
        else {
          logger::message(out,"mpt::object::set",3,"%s: %s.%s","bad property",err,name);
        }
        this_local._7_1_ = false;
      }
      else {
        pcStack_78 = (char *)0x0;
        if (pr._buf._12_4_ == -2) {
          pcStack_78 = "bad property value";
        }
        else if (pr._buf._12_4_ == -3) {
          pcStack_78 = "bad property type";
        }
        if (pcStack_78 != (char *)0x0) {
          if (pcVar2 == (char *)0x0) {
            tVar3 = value::type(val);
            if (name == (char *)0x0) {
              logger::message(out,"mpt::object::set",3,"%s: %s = <%s>",pcStack_78,err,
                              CONCAT44(uVar4,(int)tVar3));
            }
            else {
              logger::message(out,"mpt::object::set",3,"%s: %s.%s = <%d>",pcStack_78,err,name,
                              CONCAT44(uVar5,(int)tVar3));
            }
          }
          else if (name == (char *)0x0) {
            logger::message(out,"mpt::object::set",3,"%s: %s = \"%s\"",pcStack_78,err,pcVar2);
          }
          else {
            logger::message(out,"mpt::object::set",3,"%s: %s.%s = \"%s\"",pcStack_78,err,name,pcVar2
                           );
          }
        }
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool object::set(const char *name, const value &val, logger *out)
{
	static const char _fname[] = "mpt::object::set";
	const char *str;
	int ret;
	if (!(str = val.string())) {
		ret = mpt_object_set_value(this, name, &val);
	} else {
		ret = mpt_object_set_string(this, name, str, 0);
	}
	if (ret >= 0) {
		return true;
	}
	if (!out) {
		return false;
	}
	::mpt::property pr("");
	if (property(&pr) < 0) {
		pr.name = "object";
	}
	
	const char *err;
	if (ret == BadArgument) {
		err = MPT_tr("bad property");
		if (name) {
			out->message(_fname, out->Error, "%s: %s.%s", err, pr.name, name);
		} else {
			out->message(_fname, out->Error, "%s: %s", err, pr.name);
		}
		return false;
	}
	err = 0;
	if (ret == BadValue) {
		err = MPT_tr("bad property value");
	}
	else if (ret == BadType) {
		err = MPT_tr("bad property type");
	}
	
	if (err) {
		if (str) {
			if (name) {
				out->message(_fname, out->Error, "%s: %s.%s = \"%s\"", err, pr.name, name, str);
			} else {
				out->message(_fname, out->Error, "%s: %s = \"%s\"", err, pr.name, str);
			}
		}
		else {
			const int type = val.type();
			if (name) {
				out->message(_fname, out->Error, "%s: %s.%s = <%d>", err, pr.name, name, type);
			} else {
				out->message(_fname, out->Error, "%s: %s = <%s>", err, pr.name, type);
			}
		}
	}
	return false;
}